

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  TValue *pTVar4;
  lua_CFunction p_Var5;
  Table *pTVar6;
  bool bVar7;
  lua_Integer i1;
  lua_Integer i2;
  
  uVar1 = t1->tt_;
  uVar2 = t2->tt_;
  pTVar4 = t2;
  if ((uVar1 & 0x3f) != (uVar2 & 0x3f)) {
    if ((uVar2 & 0xf) != 3 || (uVar1 & 0xf) != 3) {
      return 0;
    }
    if (uVar1 == 0x13) {
      i1 = (t1->value_).i;
    }
    else {
      iVar3 = luaV_tointeger(t1,&i1,0);
      if (iVar3 == 0) {
        return 0;
      }
      uVar2 = t2->tt_;
    }
    if (uVar2 != 0x13) {
      pTVar4 = (TValue *)&i2;
      iVar3 = luaV_tointeger(t2,(lua_Integer *)pTVar4,0);
      if (iVar3 == 0) {
        return 0;
      }
    }
LAB_00119d1a:
    bVar7 = (GCObject *)i1 == (pTVar4->value_).gc;
LAB_00119d20:
    uVar2 = (uint)bVar7;
switchD_00119ca5_caseD_0:
    return uVar2;
  }
  uVar2 = 1;
  switch(uVar1 & 0x3f) {
  case 0:
    goto switchD_00119ca5_caseD_0;
  case 1:
    bVar7 = (t1->value_).b == (t2->value_).b;
    goto LAB_00119d20;
  default:
    i1 = (lua_Integer)(t1->value_).gc;
    goto LAB_00119d1a;
  case 3:
    return -(uint)((t2->value_).n == (t1->value_).n) & 1;
  case 5:
    p_Var5 = (t2->value_).f;
    if ((t1->value_).f == p_Var5) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar6 = *(Table **)((t1->value_).f + 0x28);
    if ((pTVar6 != (Table *)0x0) && ((pTVar6->flags & 0x20) == 0)) {
      pTVar4 = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
      if (pTVar4 != (TValue *)0x0) goto LAB_00119e1f;
      p_Var5 = (t2->value_).f;
    }
    pTVar6 = *(Table **)(p_Var5 + 0x28);
    break;
  case 7:
    p_Var5 = (t2->value_).f;
    if ((t1->value_).f == p_Var5) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar6 = *(Table **)((t1->value_).f + 0x10);
    if ((pTVar6 != (Table *)0x0) && ((pTVar6->flags & 0x20) == 0)) {
      pTVar4 = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
      if (pTVar4 != (TValue *)0x0) goto LAB_00119e1f;
      p_Var5 = (t2->value_).f;
    }
    pTVar6 = *(Table **)(p_Var5 + 0x10);
    break;
  case 0x14:
    iVar3 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    return iVar3;
  }
  if (pTVar6 == (Table *)0x0) {
    return 0;
  }
  if ((pTVar6->flags & 0x20) != 0) {
    return 0;
  }
  pTVar4 = luaT_gettm(pTVar6,TM_EQ,L->l_G->tmname[5]);
  if (pTVar4 == (TValue *)0x0) {
    return 0;
  }
LAB_00119e1f:
  luaT_callTM(L,pTVar4,t1,t2,L->top,1);
  iVar3 = L->top->tt_;
  if (iVar3 == 0) {
    return 0;
  }
  if (iVar3 == 1) {
    return (uint)((L->top->value_).b != 0);
  }
  return 1;
}

Assistant:

int luaV_equalobj(lua_State *L, const TValue *t1, const TValue *t2) {
    const TValue *tm;
    if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
        if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
            return 0;  /* only numbers can be equal with different variants */
        else {  /* two numbers with different variants */
            lua_Integer i1, i2;  /* compare them as integers */
            return (tointeger(t1, &i1) && tointeger(t2, &i2) && i1 == i2);
        }
    }
    /* values have same type and same variant */
    switch (ttype(t1)) {
        case LUA_TNIL:
            return 1;
        case LUA_TNUMINT:
            return (ivalue(t1) == ivalue(t2));
        case LUA_TNUMFLT:
            return luai_numeq(fltvalue(t1), fltvalue(t2));
        case LUA_TBOOLEAN:
            return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
        case LUA_TLIGHTUSERDATA:
            return pvalue(t1) == pvalue(t2);
        case LUA_TLCF:
            return fvalue(t1) == fvalue(t2);
        case LUA_TSHRSTR:
            return eqshrstr(tsvalue(t1), tsvalue(t2));
        case LUA_TLNGSTR:
            return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
        case LUA_TUSERDATA: {
            if (uvalue(t1) == uvalue(t2)) return 1;
            else if (L == NULL) return 0;
            tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
            if (tm == NULL)
                tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
            break;  /* will try TM */
        }
        case LUA_TTABLE: {
            if (hvalue(t1) == hvalue(t2)) return 1;
            else if (L == NULL) return 0;
            tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
            if (tm == NULL)
                tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
            break;  /* will try TM */
        }
        default:
            return gcvalue(t1) == gcvalue(t2);
    }
    if (tm == NULL)  /* no TM? */
        return 0;  /* objects are different */
    luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
    return !l_isfalse(L->top);
}